

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  Mutex *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RCX;
  Exception *pEVar3;
  undefined8 *puVar4;
  ReadableDirectory *extraout_RDX;
  char *pcVar5;
  ReadableDirectory *pRVar6;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  ReadableDirectory *extraout_RDX_02;
  String *ptrCopy;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar7;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar8;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  undefined1 local_48 [32];
  
  puVar4 = (undefined8 *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (in_RCX == 1) {
    this_00 = (Mutex *)(name_00.content.ptr + 1);
    local_48._0_8_ = local_48._0_8_ & 0xffffffffffffff00;
    kj::_::Mutex::lock(this_00,1);
    if (puVar4[1] == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*puVar4;
    }
    name.content.size_ = (size_t)pcVar5;
    name.content.ptr = (char *)(name_00.content.ptr + 2);
    Impl::tryGetEntry((Impl *)local_48,name);
    if ((Exception *)local_48._0_8_ == (Exception *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      if (*(int *)(local_48._0_8_ + 0x18) == 3) {
        SymlinkNode::parse((Path *)local_48,(SymlinkNode *)(local_48._0_8_ + 0x20));
        kj::_::Mutex::unlock(this_00,SHARED,(Waiter *)0x0);
        uVar2 = local_48._8_8_;
        uVar1 = local_48._0_8_;
        path_00.parts.size_ = local_48._0_8_;
        path_00.parts.ptr = name_00.content.ptr;
        MVar8 = tryOpenFile(this,path_00);
        pRVar6 = (ReadableDirectory *)MVar8.ptr.ptr;
        if ((Exception *)uVar1 != (Exception *)0x0) {
          local_48._0_8_ = (Exception *)0x0;
          local_48._8_8_ = (InMemoryFileFactory *)0x0;
          (***(_func_int ***)local_48._16_8_)
                    (local_48._16_8_,uVar1,0x18,uVar2,uVar2,
                     ArrayDisposer::Dispose_<kj::String>::destruct);
          pRVar6 = extraout_RDX_01;
        }
        goto LAB_00464f3c;
      }
      if (*(int *)(local_48._0_8_ + 0x18) == 1) {
        (**(code **)(*(long *)(((String *)(local_48._0_8_ + 0x28))->content).ptr + 0x28))(local_48);
        pEVar3 = (Exception *)local_48._8_8_;
        if ((Exception *)local_48._8_8_ != (Exception *)0x0) {
          pEVar3 = (Exception *)local_48._0_8_;
        }
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)pEVar3;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_48._8_8_;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                  ((Fault *)local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x695,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)local_48);
      }
    }
    kj::_::Mutex::unlock(this_00,SHARED,(Waiter *)0x0);
    pRVar6 = extraout_RDX_02;
  }
  else if (in_RCX == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x439,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)local_48);
    pRVar6 = extraout_RDX;
  }
  else {
    if (puVar4[1] == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*puVar4;
    }
    name_00.content.size_ = (size_t)pcVar5;
    MVar7 = tryGetParent((InMemoryDirectory *)local_48,name_00);
    pRVar6 = MVar7.ptr.ptr;
    if ((Exception *)local_48._8_8_ == (Exception *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_48._8_8_ + 0x50))
                (this,local_48._8_8_,puVar4 + 3,in_RCX + -1);
      (**(code **)(((String *)local_48._0_8_)->content).ptr)
                (local_48._0_8_,local_48._8_8_ + *(long *)(*(_func_int **)local_48._8_8_ + -0x10));
      pRVar6 = extraout_RDX_00;
    }
  }
LAB_00464f3c:
  MVar8.ptr.ptr = (ReadableFile *)pRVar6;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar8.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, entry);
      } else {
        return kj::none;
      }
    }